

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8Wrap.c
# Opt level: O1

void XUtf8_measure_extents
               (Display *display,Drawable d,XUtf8FontStruct *font_set,GC gc,int *xx,int *yy,int *ww,
               int *hh,char *string,int num_bytes)

{
  XFontStruct **ppXVar1;
  uint ucs;
  XFontStruct **ppXVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  ulong uVar6;
  ulong uVar7;
  uint uVar8;
  int iVar9;
  ulong uVar10;
  ulong uVar11;
  long lVar12;
  ulong uVar13;
  bool bVar14;
  int fnt_dsc;
  int fnt_asc;
  int dir_ret;
  XCharStruct sizes;
  XChar2b buf [128];
  undefined2 local_1e6;
  int local_1e4;
  unsigned_short local_1de;
  int local_1dc;
  uint local_1d8 [5];
  undefined1 local_1c4 [4];
  short local_1c0;
  short local_1be;
  short local_1bc;
  XFontStruct **local_1b8;
  ulong local_1b0;
  ulong local_1a8;
  ulong local_1a0;
  Display *local_198;
  GC local_190;
  ulong local_188;
  int local_180;
  uint local_17c;
  int *local_178;
  uchar *local_170;
  int *local_168;
  int *local_160;
  int *local_158;
  ulong local_150;
  long local_148;
  int *local_140;
  undefined2 local_138 [132];
  
  local_1d8[3] = 0;
  local_1d8[2] = 0;
  local_1d8[1] = 0;
  uVar10 = (ulong)font_set->nb_font;
  if (0 < (long)uVar10) {
    local_178 = font_set->encodings;
    ppXVar1 = font_set->fonts;
    if (*ppXVar1 == (XFontStruct *)0x0) {
      uVar7 = 0;
      do {
        if (uVar10 - 1 == uVar7) {
          return;
        }
        uVar11 = uVar7 + 1;
        lVar12 = uVar7 + 1;
        uVar7 = uVar11;
      } while (ppXVar1[lVar12] == (XFontStruct *)0x0);
      bVar14 = uVar11 < uVar10;
    }
    else {
      bVar14 = true;
      uVar11 = 0;
    }
    if (bVar14) {
      local_1d8[4] = num_bytes;
      uVar7 = uVar11;
      local_1b8 = ppXVar1;
      local_198 = display;
      local_190 = gc;
      local_160 = xx;
      local_158 = yy;
      if (num_bytes < 1) {
        iVar3 = 0x7fffffff;
        uVar6 = 0;
        local_1e4 = 0;
        iVar4 = 0;
      }
      else {
        local_170 = (uchar *)string;
        local_150 = uVar11 & 0xffffffff;
        local_140 = local_178 + uVar11;
        local_168 = font_set->ranges + uVar11 * 2 + 1;
        uVar13 = 0;
        iVar3 = 0x7fffffff;
        local_1e4 = 0;
        uVar6 = 0;
        local_1b0 = uVar11;
        local_1a8 = uVar10;
        do {
          ppXVar2 = local_1b8;
          local_180 = (int)uVar7;
          lVar12 = (long)local_180;
          local_1dc = iVar3;
          local_1a0 = uVar13;
          local_148 = lVar12;
          if (0x78 < (int)uVar6) {
            XSetFont(local_198,local_190,local_1b8[lVar12]->fid);
            XTextExtents16(ppXVar2[lVar12],local_138,uVar6,local_1d8 + 3,local_1d8 + 2,local_1d8 + 1
                           ,local_1c4);
            local_1e4 = local_1e4 + local_1c0;
            iVar3 = (int)local_1be;
            uVar7 = local_1a0 & 0xffffffff;
            if ((int)local_1a0 < local_1bc + iVar3) {
              uVar7 = (ulong)(uint)(local_1bc + iVar3);
            }
            if (SBORROW4(local_1dc,-iVar3) == local_1dc + iVar3 < 0) {
              local_1dc = -iVar3;
            }
            local_188 = 0;
            local_1a0 = uVar7;
            uVar6 = local_188;
          }
          local_188 = uVar6;
          local_17c = XFastConvertUtf8ToUcs(local_170,local_1d8[4],local_1d8);
          if ((int)local_17c < 2) {
            local_17c = 1;
          }
          local_1de = XUtf8IsNonSpacing(local_1d8[0]);
          iVar3 = (int)local_1a8;
          uVar8 = (uint)local_1b0;
          if (local_1de != 0) {
            local_1d8[0] = (uint)local_1de;
          }
          ucs = local_1d8[0];
          uVar7 = local_1b0 & 0xffffffff;
          if ((int)uVar8 < iVar3) {
            lVar12 = 0;
            do {
              if (ppXVar1[uVar11 + lVar12] != (XFontStruct *)0x0) {
                iVar3 = local_140[lVar12];
                iVar4 = ucs2fontmap((char *)&local_1e6,ucs,iVar3);
                if ((-1 < iVar4) &&
                   ((iVar3 != 0 ||
                    ((local_168[lVar12 * 2 + -1] <= (int)ucs && ((int)ucs <= local_168[lVar12 * 2]))
                    )))) {
                  uVar8 = (uint)local_1b0;
                  uVar7 = (ulong)((int)lVar12 + uVar8);
                  iVar3 = (int)local_1a8;
                  goto LAB_001fd4f4;
                }
              }
              lVar12 = lVar12 + 1;
            } while ((uVar11 - uVar10) + lVar12 != 0);
            iVar3 = (int)local_1a8;
            uVar7 = local_1a8 & 0xffffffff;
            uVar8 = (uint)local_1b0;
          }
LAB_001fd4f4:
          if ((int)uVar7 == iVar3) {
            ucs2fontmap((char *)&local_1e6,0x3f,local_178[local_150]);
            uVar7 = (ulong)uVar8;
          }
          lVar12 = local_148;
          ppXVar2 = local_1b8;
          if ((local_1de == 0) && (local_180 == (int)uVar7)) {
            local_138[(int)local_188] = local_1e6;
            uVar6 = (ulong)((int)local_188 + 1);
            uVar13 = local_1a0 & 0xffffffff;
            iVar3 = local_1dc;
          }
          else {
            XSetFont(local_198,local_190,local_1b8[local_148]->fid);
            XTextExtents16(ppXVar2[lVar12],local_138,local_188,local_1d8 + 3,local_1d8 + 2,
                           local_1d8 + 1,local_1c4);
            iVar4 = local_1e4 + local_1c0;
            iVar9 = (int)local_1be;
            uVar13 = (ulong)(uint)(local_1bc + iVar9);
            if (local_1bc + iVar9 <= (int)local_1a0) {
              uVar13 = local_1a0 & 0xffffffff;
            }
            iVar3 = -iVar9;
            if (SBORROW4(local_1dc,-iVar9) != local_1dc + iVar9 < 0) {
              iVar3 = local_1dc;
            }
            local_138[0] = local_1e6;
            if (local_1de == 0) {
              uVar6 = 1;
              local_1e4 = iVar4;
            }
            else {
              iVar9 = XTextWidth16(local_1b8[(int)uVar7],local_138,1);
              uVar6 = 1;
              local_1e4 = iVar4 - iVar9;
            }
          }
          local_170 = local_170 + local_17c;
          iVar4 = (int)uVar13;
          iVar9 = local_1d8[4] - local_17c;
          bVar14 = (int)local_17c <= (int)local_1d8[4];
          local_1d8[4] = iVar9;
        } while (iVar9 != 0 && bVar14);
      }
      ppXVar1 = local_1b8;
      XSetFont(local_198,local_190,local_1b8[(int)uVar7]->fid);
      XTextExtents16(ppXVar1[(int)uVar7],local_138,uVar6,local_1d8 + 3,local_1d8 + 2,local_1d8 + 1,
                     local_1c4);
      iVar5 = (int)local_1be;
      iVar9 = local_1bc + iVar5;
      if (local_1bc + iVar5 <= iVar4) {
        iVar9 = iVar4;
      }
      iVar4 = -iVar5;
      if (SBORROW4(iVar3,-iVar5) != iVar3 + iVar5 < 0) {
        iVar4 = iVar3;
      }
      *ww = local_1c0 + local_1e4;
      *hh = iVar9;
      *local_160 = 0;
      *local_158 = iVar4;
    }
  }
  return;
}

Assistant:

void
XUtf8_measure_extents(
        Display         	*display,
        Drawable        	d,
        XUtf8FontStruct  *font_set,
        GC              	gc,
        int             	*xx,     /* x-offset from origin */
        int             	*yy,     /* y-offset from origin */
        int             	*ww,     /* overall inked width  */
        int             	*hh,     /* maximum inked height */
        const char      	*string, /* text to measure */
        int             	num_bytes) {
  int 		*encodings; /* encodings array */
  XFontStruct 	**fonts;    /* fonts array */
  Fl_XChar2b 	buf[128];   /* drawing buffer */
  int 		fnum;       /* index of the current font in the fonts array*/
  int 		i;          /* current byte in the XChar2b buffer */
  int 		first;      /* first valid font index */
  int 		last_fnum;  /* font index of the previous char */
  int 		nb_font;    /* quantity of fonts in the font array */
  char 		glyph[2];   /* byte1 and byte2 value of the UTF-8 char */
  int		*ranges;    /* sub range of iso10646 */

  int wd = 0; /* accumulates the width of the text */
  int ht = 0; /* used to find max height in text */
  int hs;     /* "height sum" of current text segment */
  int yt = 0x7FFFFFFF; /* used to find bounding rectangle delta-y */
  /* int res; */ /* result from calling XTextExtents16() - we should test this is OK! */
  /* FC: the man does not specify error codes for it, but X will generate X errors like BadGC or BadFont. */

  XCharStruct sizes;
  int dir_ret = 0;
  int fnt_asc = 0;
  int fnt_dsc = 0;

  nb_font = font_set->nb_font;

  if (nb_font < 1) {
    /* there is no font in the font_set :-( */
    return;
  }
  ranges = font_set->ranges;
  fonts = font_set->fonts;
  encodings = font_set->encodings;
  i = 0;
  fnum = 0;

  while(fnum < nb_font && !fonts[fnum]) fnum++;
  if (fnum >= nb_font) {
    /* there is no valid font for the X server */
    return;
  }

  first = fnum;
  last_fnum = fnum;

  while (num_bytes > 0) {
    int 	 ulen;   /* byte length of the UTF-8 char */
    unsigned int ucs;    /* Unicode value of the UTF-8 char */
    unsigned int no_spc; /* Spacing char equivalent of a non-spacing char */

    if (i > 120) {
      /*** draw the buffer **/
      XSetFont(display, gc, fonts[fnum]->fid);
      /* res = */ XTextExtents16(fonts[fnum], buf, i, &dir_ret, &fnt_asc, &fnt_dsc, &sizes);
      /* recover the dimensions - should verify that res == 0 first! */
      wd += sizes.width; /* accumulate the width */
      hs = sizes.ascent + sizes.descent; /* total height */
      if(hs > ht) ht = hs; /* new height exceeds previous height */
      if(yt > (-sizes.ascent)) yt = -sizes.ascent; /* delta y offset */
      i = 0;
    }

    ulen = XFastConvertUtf8ToUcs((const unsigned char*)string, num_bytes, &ucs);

    if (ulen < 1) ulen = 1;

    no_spc = XUtf8IsNonSpacing(ucs);
    if (no_spc) ucs = no_spc;

    /*
     * find the first encoding which can be used to
     * draw the glyph
     */
    fnum = first;
    while (fnum < nb_font) {
      if (fonts[fnum] && ucs2fontmap(glyph, ucs, encodings[fnum]) >= 0) {
	if (encodings[fnum] != 0 ||
	    ((int)ucs >= ranges[fnum * 2] &&
	     (int)ucs <= ranges[fnum * 2 + 1])) {
	  break;
	}
      }
      fnum++;
    }
    if (fnum == nb_font) {
      /* the char is not valid in all encodings ->
       * draw it using the first font :-(
       */
      fnum = first;
      ucs2fontmap(glyph, '?', encodings[fnum]);
    }

    if (last_fnum != fnum || no_spc) {
      XSetFont(display, gc, fonts[last_fnum]->fid);
      /* res = */ XTextExtents16(fonts[last_fnum], buf, i, &dir_ret, &fnt_asc, &fnt_dsc, &sizes);
      /* recover the dimensions - should verify that res == 0 first! */
      wd += sizes.width; /* accumulate the width */
      hs = sizes.ascent + sizes.descent; /* total height */
      if(hs > ht) ht = hs; /* new height exceeds previous height */
      if(yt > (-sizes.ascent)) yt = -sizes.ascent; /* delta y offset */
      i = 0;
      (*buf).byte1 = glyph[0];
      (*buf).byte2 = glyph[1];
      if (no_spc) {
	wd -= XTextWidth16(fonts[fnum], buf, 1);
      }
    } else {
      (*(buf + i)).byte1 = glyph[0];
      (*(buf + i)).byte2 = glyph[1];
    }
    last_fnum = fnum;
    i++;
    string += ulen;
    num_bytes -= ulen;
  }

  XSetFont(display, gc, fonts[fnum]->fid);
  /* res = */ XTextExtents16(fonts[fnum], buf, i, &dir_ret, &fnt_asc, &fnt_dsc, &sizes);
  /* recover the dimensions - should verify that res == 0 first! */
  wd += sizes.width; /* accumulate the width */
  hs = sizes.ascent + sizes.descent; /* total height */
  if(hs > ht) ht = hs; /* new height exceeds previous height */
  if(yt > (-sizes.ascent)) yt = -sizes.ascent; /* delta y offset */
  /* return values */
  *ww = wd; /* width of inked area rectangle */
  *hh = ht; /* max height of inked area rectangle */
  *xx = 0;  /* x-offset from origin to start of inked area - this is wrong! */
  *yy = yt; /* y-offset from origin to start of inked rectangle */
}